

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

void __thiscall QMimeData::setHtml(QMimeData *this,QString *html)

{
  long lVar1;
  QMimeDataPrivate *this_00;
  QVariant *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QString *in_stack_ffffffffffffff78;
  QMimeDataPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMimeData *)0x3e64b0);
  textHtmlLiteral();
  ::QVariant::QVariant((QVariant *)this_00,in_stack_ffffffffffffff78);
  QMimeDataPrivate::setData(in_stack_ffffffffffffffc0,in_RDI,in_RSI);
  ::QVariant::~QVariant((QVariant *)this_00);
  QString::~QString((QString *)0x3e650c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setHtml(const QString &html)
{
    Q_D(QMimeData);
    d->setData(textHtmlLiteral(), html);
}